

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
::initPrograms(QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
               *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  char *pcVar2;
  ProgramSources *this_00;
  long lVar3;
  ulong uVar4;
  undefined1 local_368 [40];
  string local_340;
  ostringstream src;
  ostringstream source;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  poVar1 = std::operator<<((ostream *)&source,"layout(binding = 0) writeonly buffer Output {\n");
  poVar1 = std::operator<<(poVar1,"\tuint values[];\n");
  poVar1 = std::operator<<(poVar1,"} sb_out;\n\n");
  poVar1 = std::operator<<(poVar1,"void main (void) {\n");
  poVar1 = std::operator<<(poVar1,"\tuvec3 indexUvec3 = uvec3 (gl_GlobalInvocationID.x,\n");
  poVar1 = std::operator<<(poVar1,
                           "\t                          gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x,\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "\t                          gl_GlobalInvocationID.z * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x * gl_WorkGroupSize.y);\n"
                          );
  poVar1 = std::operator<<(poVar1,"\tuint index = indexUvec3.x + indexUvec3.y + indexUvec3.z;\n");
  poVar1 = std::operator<<(poVar1,"\tsb_out.values[index] += index;\n");
  std::operator<<(poVar1,"}\n");
  lVar3 = 0x18;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->m_parameters).
                             super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_parameters).
                            super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); uVar4 = uVar4 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar1 = std::operator<<((ostream *)&src,pcVar2);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"layout (local_size_x = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", local_size_y = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", local_size_z = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,") in;\n");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar1,(string *)local_368);
    std::__cxx11::string::~string((string *)local_368);
    this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                        (&sourceCollections->glslSources,
                         (string *)
                         ((long)(((this->m_parameters).
                                  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->localSize).m_data +
                         lVar3));
    std::__cxx11::stringbuf::str();
    glu::ComputeSource::ComputeSource((ComputeSource *)local_368,&local_340);
    glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_368);
    std::__cxx11::string::~string((string *)(local_368 + 8));
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    lVar3 = lVar3 + 0x38;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return;
}

Assistant:

void initPrograms(SourceCollections& sourceCollections) const
	{
		std::ostringstream	source;
		source	<< "layout(binding = 0) writeonly buffer Output {\n"
				<< "	uint values[];\n"
				<< "} sb_out;\n\n"
				<< "void main (void) {\n"
				<< "	uvec3 indexUvec3 = uvec3 (gl_GlobalInvocationID.x,\n"
				<< "	                          gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x,\n"
				<< "	                          gl_GlobalInvocationID.z * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x * gl_WorkGroupSize.y);\n"
				<< "	uint index = indexUvec3.x + indexUvec3.y + indexUvec3.z;\n"
				<< "	sb_out.values[index] += index;\n"
				<< "}\n";

		for(size_t shaderNdx = 0; shaderNdx < m_parameters.size(); ++shaderNdx)
		{
			std::ostringstream	src;
			src	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
				<< "layout (local_size_x = " << m_parameters[shaderNdx].localSize.x() << ", local_size_y = " << m_parameters[shaderNdx].localSize.y() << ", local_size_z = " << m_parameters[shaderNdx].localSize.z() << ") in;\n"
				<< source.str();
			sourceCollections.glslSources.add(m_parameters[shaderNdx].shaderName) << glu::ComputeSource(src.str());
		}
	}